

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PianoInput.cpp
# Opt level: O2

Key PianoInputTU::readBinding(QSettings *settings,QString *keyname)

{
  int iVar1;
  Key KVar2;
  Key KVar3;
  QKeySequence seq;
  QArrayDataPointer<char16_t> local_60;
  QVariant local_48;
  anon_union_24_3_e3d07ef4_for_data local_28;
  undefined8 local_10;
  
  local_28.shared = (PrivateShared *)0x0;
  local_28._8_8_ = 0;
  local_28._16_8_ = 0;
  local_10 = 2;
  QSettings::value((QString *)&local_48,(QVariant *)settings);
  QVariant::toString();
  QKeySequence::QKeySequence(&seq,(QString *)&local_60,PortableText);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
  QVariant::~QVariant(&local_48);
  QVariant::~QVariant((QVariant *)&local_28);
  iVar1 = QKeySequence::count();
  KVar3 = 0;
  if (iVar1 == 1) {
    KVar2 = QKeySequence::operator[]((uint)&seq);
    KVar3 = 0;
    if (KVar2 < 0x2000000) {
      KVar3 = KVar2;
    }
  }
  QKeySequence::~QKeySequence(&seq);
  return KVar3;
}

Assistant:

static Qt::Key readBinding(QSettings &settings, QString const& keyname) {
    QKeySequence seq(settings.value(keyname).toString(), QKeySequence::PortableText);
    // the key sequence must be 1 key and have no keyboard modifiers
    if (seq.count() == 1) {
        auto const combo = seq[0];
        if (combo.keyboardModifiers() == Qt::NoModifier) {
            return combo.key();
        }

    }

    return PianoInput::NoKey;

}